

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteSources(cmGhsMultiTargetGenerator *this,ostream *fout_proj)

{
  string *config;
  Types TVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *this_00;
  cmSourceFile *this_01;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  char *pcVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  bool bVar6;
  __type _Var7;
  string *psVar8;
  cmSourceGroup *this_02;
  mapped_type *pmVar9;
  iterator iVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  ostream *poVar13;
  cmCustomCommand *pcVar14;
  cmGeneratedFileStream *this_03;
  cmSourceFileLocation *pcVar15;
  cmSourceFile *sourceFile;
  long lVar16;
  pointer __k;
  pointer ppcVar17;
  int iVar18;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  __i;
  pointer ppcVar19;
  cmGhsMultiTargetGenerator *pcVar20;
  cmGhsMultiTargetGenerator *pcVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar22;
  pointer ppcVar23;
  pointer ppcVar24;
  pointer ppcVar25;
  string *gn_1;
  pointer pbVar26;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  undefined8 uVar27;
  _Manager_type in_stack_fffffffffffff988;
  char local_662 [2];
  ostream *local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_658;
  ostream *local_650;
  pointer local_648;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupFilesList;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  int local_604;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_600;
  string fpath;
  string gname;
  string lpath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_> gfiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groupNames;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  standardGroups;
  string local_4d0;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
  groupFiles;
  _Any_data local_468;
  undefined8 local_458;
  undefined8 uStack_450;
  cmSourceFile *sf;
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_430 [21];
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  string gn;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [456];
  string local_50;
  
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  config = &this->ConfigName;
  local_650 = fout_proj;
  cmGeneratorTarget::GetSourceFiles(this->GeneratorTarget,&sources,config);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
            (&sourceGroups,&this->Makefile->SourceGroups);
  ppcVar24 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groupFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groupNames._M_t._M_impl.super__Rb_tree_header._M_header;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groupFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppcVar23 = sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar23 != ppcVar24;
      ppcVar23 = ppcVar23 + 1) {
    sf = *ppcVar23;
    pcVar2 = this->Makefile;
    psVar8 = cmSourceFile::ResolveFullPath(sf,(string *)0x0,(string *)0x0);
    this_02 = cmMakefile::FindSourceGroup(pcVar2,psVar8,&sourceGroups);
    psVar8 = cmSourceGroup::GetFullName_abi_cxx11_(this_02);
    std::__cxx11::string::string((string *)&gn,(string *)psVar8);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,&gn);
    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back(pmVar9,&sf);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&groupNames,&gn);
    std::__cxx11::string::~string((string *)&gn);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gn,"CMake Rules",(allocator<char> *)&sf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"Header Files",(allocator<char> *)&gname);
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"Source Files",(allocator<char> *)&lpath);
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"Object Files",(allocator<char> *)&fpath);
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"Object Libraries",(allocator<char> *)&local_588);
  std::__cxx11::string::string<std::allocator<char>>
            (local_218,"Resources",(allocator<char> *)&local_4d0);
  __l._M_len = 6;
  __l._M_array = &gn;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&standardGroups,__l,(allocator_type *)&groupFilesList);
  lVar16 = 0xa0;
  do {
    std::__cxx11::string::~string(local_298 + lVar16 + -0x20);
    lVar16 = lVar16 + -0x20;
  } while (lVar16 != -0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&groupFilesList,groupFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (allocator_type *)&gn);
  iVar18 = 0;
  for (pbVar26 = standardGroups.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; lVar16 = (long)iVar18,
      pbVar26 !=
      standardGroups.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pbVar26 = pbVar26 + 1) {
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&groupNames._M_t,pbVar26);
    if ((_Rb_tree_header *)iVar10._M_node == &groupNames._M_t._M_impl.super__Rb_tree_header) {
      if ((this->TagType == CUSTOM_TARGET) &&
         (bVar6 = std::operator==(pbVar26,"CMake Rules"), bVar6)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&groupFilesList,
                 ((long)groupFilesList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)groupFilesList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
        std::__cxx11::string::_M_assign
                  ((string *)
                   (groupFilesList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar16));
        goto LAB_0037271f;
      }
    }
    else {
      std::__cxx11::string::_M_assign
                ((string *)
                 (groupFilesList.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar16));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&groupNames._M_t,pbVar26);
LAB_0037271f:
      iVar18 = iVar18 + 1;
    }
  }
  gn._M_dataplus._M_p = (pointer)&gn.field_2;
  gn._M_string_length = 0;
  gn.field_2._M_local_buf[0] = '\0';
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&groupNames._M_t,&gn);
  if ((_Rb_tree_header *)iVar10._M_node != &groupNames._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               (groupFilesList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&groupNames._M_t,&gn);
  }
  std::__cxx11::string::~string((string *)&gn);
  lVar16 = lVar16 << 5;
  p_Var11 = groupNames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pbVar26 = groupFilesList.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        (_Rb_tree_header *)p_Var11 != &groupNames._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign
              ((string *)
               ((long)&((groupFilesList.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16));
    p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    lVar16 = lVar16 + 0x20;
  }
  for (__k = groupFilesList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pbVar26; __k = __k + 1) {
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,__k);
    ppcVar24 = (pmVar9->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
               .super__Vector_impl_data._M_start;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
             ::operator[](&groupFiles,__k);
    ppcVar23 = (pmVar9->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    if (ppcVar24 != ppcVar23) {
      uVar12 = (long)ppcVar23 - (long)ppcVar24 >> 3;
      lVar16 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                (ppcVar24,ppcVar23,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppcVar23 - (long)ppcVar24 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar24,ppcVar23);
      }
      else {
        ppcVar19 = ppcVar24 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Iter_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                  (ppcVar24,ppcVar19);
        for (; ppcVar19 != ppcVar23; ppcVar19 = ppcVar19 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,__gnu_cxx::__ops::_Val_comp_iter<cmGhsMultiTargetGenerator::WriteSources(std::ostream&)::__0>>
                    (ppcVar19);
        }
      }
    }
  }
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gfiles.super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_600 = &this->Name;
  do {
    ppcVar4 = gfiles.
              super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppcVar17 = gfiles.
               super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_658 = groupFilesList.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    if (groupFilesList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        groupFilesList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (; ppcVar17 != ppcVar4; ppcVar17 = ppcVar17 + 1) {
        cmGeneratedFileStream::Close(*ppcVar17);
      }
      std::_Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::
      ~_Vector_base(&gfiles.
                     super__Vector_base<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>
                   );
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&groupFilesList);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&standardGroups);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&groupNames._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
      ::~_Rb_tree(&groupFiles._M_t);
      std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&sourceGroups);
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                (&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
      return;
    }
    this_00 = this->GeneratorTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gn,"GHS_NO_SOURCE_GROUP_FILE",(allocator<char> *)&gname);
    cmGeneratorTarget::GetProperty(this_00,&gn);
    bVar6 = cmIsOn((cmValue)0x37295c);
    if (bVar6) {
      std::__cxx11::string::~string((string *)&gn);
      pcVar21 = this;
LAB_003729bd:
      if (local_658->_M_string_length == 0) {
        poVar13 = std::operator<<(local_650,"{comment} Others");
      }
      else {
        poVar13 = std::operator<<(local_650,"{comment} ");
        poVar13 = std::operator<<(poVar13,(string *)local_658);
      }
      std::operator<<(poVar13,'\n');
      local_660 = local_650;
    }
    else {
      pcVar2 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sf,"CMAKE_GHS_NO_SOURCE_GROUP_FILE",(allocator<char> *)&lpath);
      bVar6 = cmMakefile::IsOn(pcVar2,(string *)&sf);
      std::__cxx11::string::~string((string *)&sf);
      std::__cxx11::string::~string((string *)&gn);
      pcVar21 = this;
      if (bVar6) goto LAB_003729bd;
      local_660 = local_650;
      if (local_658->_M_string_length == 0) {
LAB_00372f6c:
        std::operator<<(local_660,"{comment} Others\n");
      }
      else {
        std::__cxx11::string::string((string *)&gname,(string *)local_658);
        cmsys::SystemTools::ReplaceString(&gname,"\\","_");
        pcVar3 = cmGlobalGhsMultiGenerator::FILE_EXTENSION;
        gn._M_dataplus._M_p = (pointer)gname._M_string_length;
        gn._M_string_length = (size_type)gname._M_dataplus._M_p;
        sf = (cmSourceFile *)strlen(cmGlobalGhsMultiGenerator::FILE_EXTENSION);
        local_438._M_p = pcVar3;
        cmStrCat<>(&lpath,(cmAlphaNum *)&gn,(cmAlphaNum *)&sf);
        pcVar21 = this;
        psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                           (&this->LocalGenerator->super_cmLocalGenerator);
        gn._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
        gn._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
        sf = (cmSourceFile *)&DAT_00000001;
        local_438._M_p = (pointer)local_430;
        local_430[0]._M_local_buf[0] = '/';
        (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                  (&local_588,this->LocalGenerator,this->GeneratorTarget);
        customCommands.
        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT71(customCommands.
                               super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2f);
        cmStrCat<std::__cxx11::string,char,std::__cxx11::string>
                  (&fpath,(cmAlphaNum *)&gn,(cmAlphaNum *)&sf,&local_588,(char *)&customCommands,
                   &lpath);
        std::__cxx11::string::~string((string *)&local_588);
        this_03 = (cmGeneratedFileStream *)operator_new(0x268);
        cmGeneratedFileStream::cmGeneratedFileStream(this_03,&fpath,false,None);
        gn._M_dataplus._M_p = (pointer)this_03;
        cmGeneratedFileStream::SetCopyIfDifferent(this_03,true);
        std::vector<cmGeneratedFileStream_*,_std::allocator<cmGeneratedFileStream_*>_>::push_back
                  (&gfiles,(value_type *)&gn);
        local_660 = (ostream *)gn._M_dataplus._M_p;
        cmGlobalGhsMultiGenerator::WriteFileHeader
                  ((cmGlobalGhsMultiGenerator *)
                   (pcVar21->LocalGenerator->super_cmLocalGenerator).GlobalGenerator,
                   (ostream *)gn._M_dataplus._M_p);
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,(ostream *)gn._M_dataplus._M_p);
        poVar13 = std::operator<<(local_650,(string *)&lpath);
        std::operator<<(poVar13," ");
        GhsMultiGpj::WriteGpjTag(SUBPROJECT,local_650);
        std::__cxx11::string::~string((string *)&fpath);
        std::__cxx11::string::~string((string *)&lpath);
        std::__cxx11::string::~string((string *)&gname);
        if (local_658->_M_string_length == 0) goto LAB_00372f6c;
      }
    }
    pbVar22 = local_658;
    bVar6 = std::operator!=(local_658,"CMake Rules");
    if (bVar6) {
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
               ::operator[](&groupFiles,pbVar22);
      local_648 = (pmVar9->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar24 = (pmVar9->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                      _M_impl.super__Vector_impl_data._M_start; ppcVar24 != local_648;
          ppcVar24 = ppcVar24 + 1) {
        this_01 = *ppcVar24;
        psVar8 = cmSourceFile::GetFullPath_abi_cxx11_(this_01);
        std::__cxx11::string::string((string *)&gn,(string *)psVar8);
        cmSystemTools::ConvertToOutputSlashes(&gn);
        sf = (cmSourceFile *)local_430;
        local_438._M_p = (pointer)0x0;
        local_430[0]._M_local_buf[0] = '\0';
        TVar1 = pcVar21->TagType;
        if ((TVar1 == CUSTOM_TARGET) &&
           (cmSourceFile::GetLanguage_abi_cxx11_(&local_4d0,this_01),
           local_4d0._M_string_length != 0)) {
          std::__cxx11::string::~string((string *)&local_4d0);
LAB_00372af5:
          bVar6 = true;
          std::__cxx11::string::assign((char *)&sf);
        }
        else {
          pcVar14 = cmSourceFile::GetCustomCommand(this_01);
          if (TVar1 == CUSTOM_TARGET) {
            std::__cxx11::string::~string((string *)&local_4d0);
          }
          if (pcVar14 != (cmCustomCommand *)0x0) goto LAB_00372af5;
          bVar6 = false;
        }
        poVar13 = std::operator<<(local_660,(string *)&sf);
        poVar13 = std::operator<<(poVar13,(string *)&gn);
        WriteObjectLangOverride_abi_cxx11_(&gname,(cmGhsMultiTargetGenerator *)this_01,sourceFile);
        poVar13 = std::operator<<(poVar13,(string *)&gname);
        std::operator<<(poVar13,'\n');
        std::__cxx11::string::~string((string *)&gname);
        if (!bVar6) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gname,"INCLUDE_DIRECTORIES",(allocator<char> *)&fpath);
          pcVar20 = (cmGhsMultiTargetGenerator *)&lpath;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lpath,"-I",(allocator<char> *)&local_588);
          WriteSourceProperty(pcVar20,local_660,this_01,&gname,&lpath);
          std::__cxx11::string::~string((string *)&lpath);
          std::__cxx11::string::~string((string *)&gname);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gname,"COMPILE_DEFINITIONS",(allocator<char> *)&fpath);
          pcVar20 = (cmGhsMultiTargetGenerator *)&lpath;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lpath,"-D",(allocator<char> *)&local_588);
          WriteSourceProperty(pcVar20,local_660,this_01,&gname,&lpath);
          std::__cxx11::string::~string((string *)&lpath);
          std::__cxx11::string::~string((string *)&gname);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gname,"COMPILE_OPTIONS",(allocator<char> *)&fpath);
          pcVar20 = (cmGhsMultiTargetGenerator *)&lpath;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&lpath,"",(allocator<char> *)&local_588);
          WriteSourceProperty(pcVar20,local_660,this_01,&gname,&lpath);
          std::__cxx11::string::~string((string *)&lpath);
          std::__cxx11::string::~string((string *)&gname);
          psVar8 = cmGeneratorTarget::GetObjectName_abi_cxx11_(pcVar21->GeneratorTarget,this_01);
          std::__cxx11::string::string((string *)&gname,(string *)psVar8);
          if ((gname._M_string_length != 0) &&
             (bVar6 = cmGeneratorTarget::HasExplicitObjectName(pcVar21->GeneratorTarget,this_01),
             bVar6)) {
            poVar13 = std::operator<<(local_660,"    -o ");
            poVar13 = std::operator<<(poVar13,(string *)&gname);
            std::operator<<(poVar13,'\n');
          }
          std::__cxx11::string::~string((string *)&gname);
        }
        std::__cxx11::string::~string((string *)&sf);
        std::__cxx11::string::~string((string *)&gn);
      }
    }
    else {
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar6 = ComputeCustomCommandOrder(pcVar21,&customCommands);
      ppcVar5 = customCommands.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (bVar6) {
        psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar21->GeneratorTarget);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sf,
                       "The custom commands for target [",psVar8);
        pbVar22 = &gn;
        std::operator+(pbVar22,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &sf,"] had a cycle.\n");
        std::__cxx11::string::~string((string *)&sf);
        cmSystemTools::Error(pbVar22);
      }
      else {
        do {
          ppcVar25 = ppcVar5;
          if (ppcVar25 ==
              customCommands.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) goto LAB_00372fea;
          pcVar15 = cmSourceFile::GetLocation(*ppcVar25);
          std::operator+(&gn,local_600,".rule");
          _Var7 = std::operator==(&pcVar15->Name,&gn);
          std::__cxx11::string::~string((string *)&gn);
          ppcVar5 = ppcVar25 + 1;
        } while (!_Var7);
        std::_V2::
        __rotate<__gnu_cxx::__normal_iterator<cmSourceFile_const**,std::vector<cmSourceFile_const*,std::allocator<cmSourceFile_const*>>>>
                  (ppcVar25,ppcVar25 + 1,
                   customCommands.
                   super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
LAB_00372fea:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lpath,".sh",(allocator<char> *)&gn);
        ppcVar5 = customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        local_648 = (pointer)((ulong)local_648 & 0xffffffff00000000);
        for (ppcVar25 = customCommands.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; ppcVar25 != ppcVar5;
            ppcVar25 = ppcVar25 + 1) {
          pcVar14 = cmSourceFile::GetCustomCommand(*ppcVar25);
          uVar27 = 0x373044;
          std::__cxx11::string::string((string *)&local_50,(string *)config);
          local_2e0._M_engaged = false;
          local_468._M_unused._M_object = (void *)0x0;
          local_468._8_8_ = 0;
          local_458 = 0;
          uStack_450 = 0;
          computeInternalDepfile.super__Function_base._M_functor._8_8_ = uVar27;
          computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_468;
          computeInternalDepfile.super__Function_base._M_manager = in_stack_fffffffffffff988;
          computeInternalDepfile._M_invoker = (_Invoker_type)pcVar21;
          pcVar20 = pcVar21;
          cmCustomCommandGenerator::cmCustomCommandGenerator
                    ((cmCustomCommandGenerator *)&sf,pcVar14,&local_50,
                     &pcVar21->LocalGenerator->super_cmLocalGenerator,true,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_2e0,computeInternalDepfile);
          std::_Function_base::~_Function_base((_Function_base *)&local_468);
          std::
          _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_M_reset(&local_2e0);
          std::__cxx11::string::~string((string *)&local_50);
          psVar8 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                             (&pcVar21->LocalGenerator->super_cmLocalGenerator);
          gn._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
          gn._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
          gname._M_dataplus._M_p = &DAT_00000001;
          gname._M_string_length = (size_type)&gname.field_2;
          gname.field_2._M_local_buf[0] = '/';
          (*(pcVar21->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xe])
                    (&local_588,pcVar21->LocalGenerator,pcVar21->GeneratorTarget);
          local_662[1] = 0x2f;
          local_604 = (int)local_648;
          local_662[0] = '_';
          pcVar15 = cmSourceFile::GetLocation(*ppcVar25);
          cmStrCat<std::__cxx11::string,char,std::__cxx11::string,char[4],int,char,std::__cxx11::string,std::__cxx11::string>
                    (&fpath,(cmAlphaNum *)&gn,(cmAlphaNum *)&gname,&local_588,local_662 + 1,
                     local_600,(char (*) [4])"_cc",&local_604,local_662,&pcVar15->Name,&lpath);
          std::__cxx11::string::~string((string *)&local_588);
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)&gn,&fpath,false,None);
          cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)&gn,true);
          WriteCustomCommandsHelper(pcVar20,(ostream *)&gn,(cmCustomCommandGenerator *)&sf);
          pcVar21 = (cmGhsMultiTargetGenerator *)&gn;
          cmGeneratedFileStream::Close((cmGeneratedFileStream *)&gn);
          WriteCustomCommandLine(pcVar21,local_660,&fpath,(cmCustomCommandGenerator *)&sf);
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&gn);
          std::__cxx11::string::~string((string *)&fpath);
          cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&sf);
          local_648 = (pointer)CONCAT44(local_648._4_4_,(int)local_648 + 1);
          pcVar21 = pcVar20;
        }
        pbVar22 = &lpath;
      }
      std::__cxx11::string::~string((string *)pbVar22);
      if (pcVar21->TagType == CUSTOM_TARGET) {
        WriteBuildEvents(pcVar21,local_660);
      }
      std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
                (&customCommands.
                  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>);
    }
    groupFilesList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_658 + 1;
    this = pcVar21;
  } while( true );
}

Assistant:

void cmGhsMultiTargetGenerator::WriteSources(std::ostream& fout_proj)
{
  /* vector of all sources for this target */
  std::vector<cmSourceFile*> sources;
  this->GeneratorTarget->GetSourceFiles(sources, this->ConfigName);

  /* vector of all groups defined for this target
   * -- but the vector is not expanded with sub groups or in any useful order
   */
  std::vector<cmSourceGroup> sourceGroups = this->Makefile->GetSourceGroups();

  /* for each source file assign it to its group */
  std::map<std::string, std::vector<cmSourceFile*>> groupFiles;
  std::set<std::string> groupNames;
  for (cmSourceFile* sf : sources) {
    cmSourceGroup* sourceGroup =
      this->Makefile->FindSourceGroup(sf->ResolveFullPath(), sourceGroups);
    std::string gn = sourceGroup->GetFullName();
    groupFiles[gn].push_back(sf);
    groupNames.insert(std::move(gn));
  }

  /* list of known groups and the order they are displayed in a project file */
  const std::vector<std::string> standardGroups = {
    "CMake Rules",  "Header Files",     "Source Files",
    "Object Files", "Object Libraries", "Resources"
  };

  /* list of groups in the order they are displayed in a project file*/
  std::vector<std::string> groupFilesList(groupFiles.size());

  /* put the groups in the order they should be listed
   * - standard groups first, and then everything else
   *   in the order used by std::map.
   */
  int i = 0;
  for (const std::string& gn : standardGroups) {
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList[i] = *n;
      i += 1;
      groupNames.erase(gn);
    } else if (this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
               gn == "CMake Rules") {
      /* make sure that rules folder always exists in case of custom targets
       * that have no custom commands except for pre or post build events.
       */
      groupFilesList.resize(groupFilesList.size() + 1);
      groupFilesList[i] = gn;
      i += 1;
    }
  }

  { /* catch-all group - is last item */
    std::string gn;
    auto n = groupNames.find(gn);
    if (n != groupNames.end()) {
      groupFilesList.back() = *n;
      groupNames.erase(gn);
    }
  }

  for (const auto& n : groupNames) {
    groupFilesList[i] = n;
    i += 1;
  }

  /* sort the files within each group */
  for (auto& n : groupFilesList) {
    std::sort(groupFiles[n].begin(), groupFiles[n].end(),
              [](cmSourceFile* l, cmSourceFile* r) {
                return l->ResolveFullPath() < r->ResolveFullPath();
              });
  }

  /* list of open project files */
  std::vector<cmGeneratedFileStream*> gfiles;

  /* write files into the proper project file
   * -- groups go into main project file
   *    unless NO_SOURCE_GROUP_FILE property or variable is set.
   */
  for (auto& sg : groupFilesList) {
    std::ostream* fout;
    bool useProjectFile =
      cmIsOn(this->GeneratorTarget->GetProperty("GHS_NO_SOURCE_GROUP_FILE")) ||
      this->Makefile->IsOn("CMAKE_GHS_NO_SOURCE_GROUP_FILE");
    if (useProjectFile || sg.empty()) {
      fout = &fout_proj;
    } else {
      // Open the filestream in copy-if-different mode.
      std::string gname = sg;
      cmsys::SystemTools::ReplaceString(gname, "\\", "_");
      std::string lpath =
        cmStrCat(gname, cmGlobalGhsMultiGenerator::FILE_EXTENSION);
      std::string fpath = cmStrCat(
        this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
        this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget), '/',
        lpath);
      cmGeneratedFileStream* f = new cmGeneratedFileStream(fpath);
      f->SetCopyIfDifferent(true);
      gfiles.push_back(f);
      fout = f;
      this->GetGlobalGenerator()->WriteFileHeader(*f);
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, *f);
      fout_proj << lpath << " ";
      GhsMultiGpj::WriteGpjTag(GhsMultiGpj::SUBPROJECT, fout_proj);
    }

    if (useProjectFile) {
      if (sg.empty()) {
        *fout << "{comment} Others" << '\n';
      } else {
        *fout << "{comment} " << sg << '\n';
      }
    } else if (sg.empty()) {
      *fout << "{comment} Others\n";
    }

    if (sg != "CMake Rules") {
      /* output rule for each source file */
      for (const cmSourceFile* si : groupFiles[sg]) {
        bool compile = true;
        // Convert filename to native system
        // WORKAROUND: GHS MULTI 6.1.4 and 6.1.6 are known to need backslash on
        // windows when opening some files from the search window.
        std::string fname(si->GetFullPath());
        cmSystemTools::ConvertToOutputSlashes(fname);

        /* For custom targets list any associated sources,
         * comment out source code to prevent it from being
         * compiled when processing this target.
         * Otherwise, comment out any custom command (main) dependencies that
         * are listed as source files to prevent them from being considered
         * part of the build.
         */
        std::string comment;
        if ((this->TagType == GhsMultiGpj::CUSTOM_TARGET &&
             !si->GetLanguage().empty()) ||
            si->GetCustomCommand()) {
          comment = "{comment} ";
          compile = false;
        }

        *fout << comment << fname << WriteObjectLangOverride(si) << '\n';
        if (compile) {
          this->WriteSourceProperty(*fout, si, "INCLUDE_DIRECTORIES", "-I");
          this->WriteSourceProperty(*fout, si, "COMPILE_DEFINITIONS", "-D");
          this->WriteSourceProperty(*fout, si, "COMPILE_OPTIONS", "");

          /* to avoid clutter in the GUI only print out the objectName if it
           * has been renamed */
          std::string objectName = this->GeneratorTarget->GetObjectName(si);
          if (!objectName.empty() &&
              this->GeneratorTarget->HasExplicitObjectName(si)) {
            *fout << "    -o " << objectName << '\n';
          }
        }
      }
    } else {
      std::vector<cmSourceFile const*> customCommands;
      if (this->ComputeCustomCommandOrder(customCommands)) {
        std::string message = "The custom commands for target [" +
          this->GeneratorTarget->GetName() + "] had a cycle.\n";
        cmSystemTools::Error(message);
      } else {
        /* Custom targets do not have a dependency on SOURCES files.
         * Therefore the dependency list may include SOURCES files after the
         * custom target. Because nothing can depend on the custom target just
         * move it to the last item.
         */
        for (auto sf = customCommands.begin(); sf != customCommands.end();
             ++sf) {
          if (((*sf)->GetLocation()).GetName() == this->Name + ".rule") {
            std::rotate(sf, sf + 1, customCommands.end());
            break;
          }
        }
        int cmdcount = 0;
#ifdef _WIN32
        std::string fext = ".bat";
#else
        std::string fext = ".sh";
#endif
        for (auto& sf : customCommands) {
          const cmCustomCommand* cc = sf->GetCustomCommand();
          cmCustomCommandGenerator ccg(*cc, this->ConfigName,
                                       this->LocalGenerator);

          // Open the filestream for this custom command
          std::string fname = cmStrCat(
            this->LocalGenerator->GetCurrentBinaryDirectory(), '/',
            this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
            '/', this->Name, "_cc", cmdcount++, '_',
            (sf->GetLocation()).GetName(), fext);

          cmGeneratedFileStream f(fname);
          f.SetCopyIfDifferent(true);
          this->WriteCustomCommandsHelper(f, ccg);
          f.Close();
          this->WriteCustomCommandLine(*fout, fname, ccg);
        }
      }
      if (this->TagType == GhsMultiGpj::CUSTOM_TARGET) {
        this->WriteBuildEvents(*fout);
      }
    }
  }

  for (cmGeneratedFileStream* f : gfiles) {
    f->Close();
  }
}